

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TType::getBasicString(TBasicType t)

{
  char *pcStack_10;
  TBasicType t_local;
  
  switch(t) {
  case EbtVoid:
    pcStack_10 = "void";
    break;
  case EbtFloat:
    pcStack_10 = "float";
    break;
  case EbtDouble:
    pcStack_10 = "double";
    break;
  case EbtFloat16:
    pcStack_10 = "float16_t";
    break;
  case EbtInt8:
    pcStack_10 = "int8_t";
    break;
  case EbtUint8:
    pcStack_10 = "uint8_t";
    break;
  case EbtInt16:
    pcStack_10 = "int16_t";
    break;
  case EbtUint16:
    pcStack_10 = "uint16_t";
    break;
  case EbtInt:
    pcStack_10 = "int";
    break;
  case EbtUint:
    pcStack_10 = "uint";
    break;
  case EbtInt64:
    pcStack_10 = "int64_t";
    break;
  case EbtUint64:
    pcStack_10 = "uint64_t";
    break;
  case EbtBool:
    pcStack_10 = "bool";
    break;
  case EbtAtomicUint:
    pcStack_10 = "atomic_uint";
    break;
  case EbtSampler:
    pcStack_10 = "sampler/image";
    break;
  case EbtStruct:
    pcStack_10 = "structure";
    break;
  case EbtBlock:
    pcStack_10 = "block";
    break;
  case EbtAccStruct:
    pcStack_10 = "accelerationStructureNV";
    break;
  case EbtReference:
    pcStack_10 = "reference";
    break;
  case EbtRayQuery:
    pcStack_10 = "rayQueryEXT";
    break;
  default:
    pcStack_10 = "unknown type";
    break;
  case EbtCoopmat:
    pcStack_10 = "coopmat";
    break;
  case EbtTensorLayoutNV:
    pcStack_10 = "tensorLayoutNV";
    break;
  case EbtTensorViewNV:
    pcStack_10 = "tensorViewNV";
    break;
  case EbtCoopvecNV:
    pcStack_10 = "coopvecNV";
    break;
  case EbtSpirvType:
    pcStack_10 = "spirv_type";
    break;
  case EbtString:
    pcStack_10 = "string";
  }
  return pcStack_10;
}

Assistant:

static const char* getBasicString(TBasicType t)
    {
        switch (t) {
        case EbtFloat:             return "float";
        case EbtInt:               return "int";
        case EbtUint:              return "uint";
        case EbtSampler:           return "sampler/image";
        case EbtVoid:              return "void";
        case EbtDouble:            return "double";
        case EbtFloat16:           return "float16_t";
        case EbtInt8:              return "int8_t";
        case EbtUint8:             return "uint8_t";
        case EbtInt16:             return "int16_t";
        case EbtUint16:            return "uint16_t";
        case EbtInt64:             return "int64_t";
        case EbtUint64:            return "uint64_t";
        case EbtBool:              return "bool";
        case EbtAtomicUint:        return "atomic_uint";
        case EbtStruct:            return "structure";
        case EbtBlock:             return "block";
        case EbtAccStruct:         return "accelerationStructureNV";
        case EbtRayQuery:          return "rayQueryEXT";
        case EbtReference:         return "reference";
        case EbtString:            return "string";
        case EbtSpirvType:         return "spirv_type";
        case EbtCoopmat:           return "coopmat";
        case EbtTensorLayoutNV:    return "tensorLayoutNV";
        case EbtTensorViewNV:      return "tensorViewNV";
        case EbtCoopvecNV:         return "coopvecNV";
        default:                   return "unknown type";
        }
    }